

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O2

void __thiscall QRhiGles2::releaseCachedResources(QRhiGles2 *this)

{
  Span *pSVar1;
  bool bVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  piter local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ensureContext(this,(QSurface *)0x0);
  if (bVar2) {
    local_30 = (piter)QHash<QRhiShaderStage,_unsigned_int>::begin(&this->m_shaderCache);
    while( true ) {
      if (local_30.d == (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0 &&
          local_30.bucket == 0) break;
      pSVar1 = (local_30.d)->spans;
      uVar3 = local_30.bucket >> 7;
      (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
        [0x45])((ulong)*(uint *)(pSVar1[uVar3].entries
                                 [pSVar1[uVar3].offsets[(uint)local_30.bucket & 0x7f]].storage.data
                                + 0x18));
      QHashPrivate::iterator<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_>::operator++
                (&local_30);
    }
    QHash<QRhiShaderStage,_unsigned_int>::clear(&this->m_shaderCache);
    QHash<QByteArray,_QRhiGles2::PipelineCacheData>::clear(&this->m_pipelineCache);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiGles2::releaseCachedResources()
{
    if (!ensureContext())
        return;

    for (uint shader : m_shaderCache)
        f->glDeleteShader(shader);

    m_shaderCache.clear();

    m_pipelineCache.clear();
}